

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  Node *this_00;
  Node **ppNVar1;
  mapped_type *pmVar2;
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar3;
  _Base_ptr p_Var4;
  Node **child;
  long lVar5;
  Node **ppNVar6;
  uint eagerness_00;
  Reader *aux;
  Reader *schemaNode;
  NullableValue<capnp::schema::Node::Reader> schema;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_a0;
  
  schema._0_8_ = this;
  pmVar2 = std::__detail::
           _Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)seen,(key_type *)&schema);
  if ((eagerness & ~*pmVar2) != 0) {
    *pmVar2 = *pmVar2 | eagerness;
    MVar3 = getContent(this,FINISHED);
    if (MVar3.ptr != (Content *)0x0) {
      loadFinalSchema(this,finalLoader);
      getFinalSchema(&local_d8,this);
      schema.isSet = local_d8.ptr.isSet;
      if (local_d8.ptr.isSet != false) {
        schema.field_1._32_8_ = local_d8.ptr.field_1._32_8_;
        schema.field_1._40_8_ = local_d8.ptr.field_1._40_8_;
        schema.field_1.value._reader.data = local_d8.ptr.field_1.value._reader.data;
        schema.field_1.value._reader.pointers = local_d8.ptr.field_1.value._reader.pointers;
        schema.field_1.value._reader.segment = local_d8.ptr.field_1.value._reader.segment;
        schema.field_1.value._reader.capTable = local_d8.ptr.field_1.value._reader.capTable;
        if (0x7fff < eagerness && local_d8.ptr.isSet == true) {
          eagerness_00 = eagerness & 0xffff8000 | eagerness >> 0xf;
          traverseNodeDependencies
                    (this,&schema.field_1.value,eagerness_00,seen,finalLoader,sourceInfo);
          schemaNode = ((MVar3.ptr)->auxSchemas).ptr;
          for (lVar5 = ((MVar3.ptr)->auxSchemas).size_ * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
            traverseNodeDependencies(this,schemaNode,eagerness_00,seen,finalLoader,sourceInfo);
            schemaNode = schemaNode + 1;
          }
        }
      }
      kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
      addAll<kj::Array<capnp::schema::Node::SourceInfo::Reader>&>
                (sourceInfo,&(MVar3.ptr)->sourceInfo);
    }
    if (((eagerness & 2) != 0) && (this_00 = (this->parent).ptr, this_00 != (Node *)0x0)) {
      traverse(this_00,eagerness,seen,finalLoader,sourceInfo);
    }
    if ((eagerness & 4) != 0) {
      MVar3 = getContent(this,EXPANDED);
      if (MVar3.ptr != (Content *)0x0) {
        ppNVar1 = ((MVar3.ptr)->orderedNestedNodes).builder.pos;
        for (ppNVar6 = ((MVar3.ptr)->orderedNestedNodes).builder.ptr; ppNVar6 != ppNVar1;
            ppNVar6 = ppNVar6 + 1) {
          traverse(*ppNVar6,eagerness,seen,finalLoader,sourceInfo);
        }
        for (p_Var4 = ((MVar3.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &((MVar3.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          Alias::compile(&local_a0,(Alias *)p_Var4[1]._M_right);
          if ((local_a0.ptr.isSet == true) && (local_a0.ptr.field_1.value.tag - 1 < 2)) {
            local_a0.ptr.field_1.value.tag = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_MAYBE(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(*schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content->auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content->sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_MAYBE(p, parent) {
      p->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
      for (auto& child: content->orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content->aliases) {
        child.second->compile();
      }
    }
  }
}